

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

void __thiscall wasm::AccessInstrumenter::visitStore(AccessInstrumenter *this,Store *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Function *__x;
  size_type sVar1;
  Module *pMVar2;
  Call *expression;
  PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_> *this_00;
  bool local_c1;
  Type local_c0 [3];
  allocator<wasm::Expression_*> local_a1;
  uintptr_t local_a0;
  Expression *local_98;
  Const *local_90;
  Expression *local_88;
  iterator local_80;
  size_type local_78;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_70;
  string_view local_58;
  size_t local_48;
  char *pcStack_40;
  Memory *local_30;
  Memory *memory;
  Builder builder;
  Store *curr_local;
  AccessInstrumenter *this_local;
  
  __x = Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>::
        getFunction(&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>_>
                     ).
                     super_PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                     .
                     super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                   );
  sVar1 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                    (&this->ignoreFunctions,(key_type *)__x);
  local_c1 = true;
  if (sVar1 == 0) {
    builder.wasm._4_4_ = 1;
    local_c1 = wasm::Type::operator==
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)13>).
                           super_Expression.type,(BasicType *)((long)&builder.wasm + 4));
  }
  if (local_c1 == false) {
    this_00 = &(this->
               super_WalkerPass<wasm::PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>_>
               ).
               super_PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
    ;
    pMVar2 = Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>::
             getModule(&this_00->
                        super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                      );
    Builder::Builder((Builder *)&memory,pMVar2);
    pMVar2 = Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>::
             getModule(&this_00->
                        super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
                      );
    local_48 = (curr->memory).super_IString.str._M_len;
    pcStack_40 = (curr->memory).super_IString.str._M_str;
    local_30 = Module::getMemory(pMVar2,(Name)(curr->memory).super_IString.str);
    local_58 = (string_view)getStoreName(curr);
    local_98 = curr->ptr;
    local_a0 = (local_30->addressType).id;
    local_90 = Builder::makeConstPtr((Builder *)&memory,(curr->offset).addr,(Type)local_a0);
    local_88 = curr->value;
    local_80 = &local_98;
    local_78 = 3;
    std::allocator<wasm::Expression_*>::allocator(&local_a1);
    __l._M_len = local_78;
    __l._M_array = local_80;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_70,__l,&local_a1);
    wasm::Type::Type(local_c0,none);
    expression = Builder::makeCall((Builder *)&memory,(Name)local_58,&local_70,local_c0[0],false);
    Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>::replaceCurrent
              (&this_00->
                super_Walker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>
               ,(Expression *)expression);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_70);
    std::allocator<wasm::Expression_*>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (ignoreFunctions.count(getFunction()->name) != 0 ||
        curr->type == Type::unreachable) {
      return;
    }
    Builder builder(*getModule());
    auto memory = getModule()->getMemory(curr->memory);
    replaceCurrent(builder.makeCall(
      getStoreName(curr),
      {curr->ptr,
       builder.makeConstPtr(curr->offset.addr, memory->addressType),
       curr->value},
      Type::none));
  }